

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall helics::MessageFederate::MessageFederate(MessageFederate *this,bool param_2)

{
  byte bVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  Federate *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  Federate::Federate(in_stack_ffffffffffffffd0);
  *in_RDI = 0x925718;
  in_RDI[2] = 0x9257e0;
  std::
  unique_ptr<helics::MessageFederateManager,std::default_delete<helics::MessageFederateManager>>::
  unique_ptr<std::default_delete<helics::MessageFederateManager>,void>
            ((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              *)(in_RDI + 1));
  loadFederateData((MessageFederate *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

MessageFederate::MessageFederate(bool /*unused*/)
{  // this constructor should only be called by child class that has already constructed the
   // underlying federate in
    // a virtual inheritance
    loadFederateData();
}